

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heterovector.hpp
# Opt level: O1

int __thiscall heterovector::count(heterovector *this,variant<int,_float,_double> val)

{
  pointer pvVar1;
  byte in_DL;
  int iVar2;
  pointer pvVar3;
  variant<int,_float,_double> i;
  bool local_69;
  variant<int,_float,_double> local_68;
  anon_class_16_2_9763bfdf local_58;
  _Variadic_union<int,_float,_double> local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  pvVar3 = (this->vec).
           super__Vector_base<std::variant<int,_float,_double>,_std::allocator<std::variant<int,_float,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (this->vec).
           super__Vector_base<std::variant<int,_float,_double>,_std::allocator<std::variant<int,_float,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  iVar2 = 0;
  if (pvVar3 != pvVar1) {
    local_68.super__Variant_base<int,_float,_double>.super__Move_assign_alias<int,_float,_double>.
    super__Copy_assign_alias<int,_float,_double>.super__Move_ctor_alias<int,_float,_double>.
    super__Copy_ctor_alias<int,_float,_double>.super__Variant_storage_alias<int,_float,_double>.
    _M_index = in_DL;
    do {
      local_48._M_first._M_storage =
           (_Uninitialized<int,_true>)
           *(undefined4 *)
            &(pvVar3->super__Variant_base<int,_float,_double>).
             super__Move_assign_alias<int,_float,_double>.
             super__Copy_assign_alias<int,_float,_double>.super__Move_ctor_alias<int,_float,_double>
             .super__Copy_ctor_alias<int,_float,_double>.
             super__Variant_storage_alias<int,_float,_double>._M_u;
      local_48._4_4_ =
           *(undefined4 *)
            ((long)&(pvVar3->super__Variant_base<int,_float,_double>).
                    super__Move_assign_alias<int,_float,_double>.
                    super__Copy_assign_alias<int,_float,_double>.
                    super__Move_ctor_alias<int,_float,_double>.
                    super__Copy_ctor_alias<int,_float,_double>.
                    super__Variant_storage_alias<int,_float,_double>._M_u + 4);
      uStack_40 = *(undefined4 *)
                   &(pvVar3->super__Variant_base<int,_float,_double>).
                    super__Move_assign_alias<int,_float,_double>.
                    super__Copy_assign_alias<int,_float,_double>.
                    super__Move_ctor_alias<int,_float,_double>.
                    super__Copy_ctor_alias<int,_float,_double>.
                    super__Variant_storage_alias<int,_float,_double>._M_index;
      uStack_3c = *(undefined4 *)
                   &(pvVar3->super__Variant_base<int,_float,_double>).
                    super__Move_assign_alias<int,_float,_double>.
                    super__Copy_assign_alias<int,_float,_double>.
                    super__Move_ctor_alias<int,_float,_double>.
                    super__Copy_ctor_alias<int,_float,_double>.
                    super__Variant_storage_alias<int,_float,_double>.field_0xc;
      local_69 = true;
      local_58.__ret = &local_69;
      local_58.__lhs = (variant<int,_float,_double> *)&local_48;
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:1232:3)_&&,_const_std::variant<int,_float,_double>_&>
        ::_S_vtable._M_arr
        [local_68.super__Variant_base<int,_float,_double>.
         super__Move_assign_alias<int,_float,_double>.super__Copy_assign_alias<int,_float,_double>.
         super__Move_ctor_alias<int,_float,_double>.super__Copy_ctor_alias<int,_float,_double>.
         super__Variant_storage_alias<int,_float,_double>._M_index]._M_data)(&local_58,&local_68);
      iVar2 = iVar2 + (uint)local_69;
      pvVar3 = pvVar3 + 1;
    } while (pvVar3 != pvVar1);
  }
  return iVar2;
}

Assistant:

int heterovector::count(std::variant<int, float, double> val) {
    int counter = 0;
    for (auto i : vec)
        if (i == val)
            counter++;

    return counter;
}